

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

void json_value_free(JSON_Value *value)

{
  int iVar1;
  JSON_Object *object;
  unsigned_long *puVar2;
  
  if (value == (JSON_Value *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = value->type;
  }
  if (iVar1 == 2) {
    object = (JSON_Object *)(value->value).string.chars;
  }
  else if (iVar1 == 5) {
    object = (value->value).object;
    if (object->hashes != (unsigned_long *)0x0) {
      puVar2 = (unsigned_long *)0x0;
      do {
        json_value_free((JSON_Value *)object->cells[(long)puVar2]);
        puVar2 = (unsigned_long *)((long)puVar2 + 1);
      } while (puVar2 < object->hashes);
    }
    (*parson_free)(object->cells);
  }
  else {
    if (iVar1 != 4) goto LAB_001539a1;
    object = (value->value).object;
    json_object_deinit(object,1,1);
  }
  (*parson_free)(object);
LAB_001539a1:
  (*parson_free)(value);
  return;
}

Assistant:

void json_value_free(JSON_Value *value) {
    switch (json_value_get_type(value)) {
        case JSONObject:
            json_object_free(value->value.object);
            break;
        case JSONString:
            parson_free(value->value.string.chars);
            break;
        case JSONArray:
            json_array_free(value->value.array);
            break;
        default:
            break;
    }
    parson_free(value);
}